

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::SetIntegrationRule
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,int ord)

{
  TPZManVector<int,_3> *in_RDI;
  TPZManVector<int,_3> order;
  TPZVec<int> *in_stack_00000068;
  TPZIntPrism3D *in_stack_00000070;
  int *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffc8;
  TPZManVector<int,_3> *in_stack_ffffffffffffffd0;
  
  TPZManVector<int,_3>::TPZManVector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  TPZIntPrism3D::SetOrder(in_stack_00000070,in_stack_00000068,this._4_4_);
  TPZManVector<int,_3>::~TPZManVector(in_RDI);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SetIntegrationRule(int ord) {
	TPZManVector<int,3> order(TSHAPE::Dimension,ord);
	this->fIntRule.SetOrder(order);
}